

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

int * WM_Mix(midi *handle,int *buffer,unsigned_long count)

{
  double (*padVar1) [58];
  byte bVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  _sample *p_Var6;
  _note *p_Var7;
  uint uVar8;
  _note *p_Var9;
  double *pdVar10;
  _note *p_Var11;
  FBoolCVar *pFVar12;
  long lVar13;
  _note **pp_Var14;
  int iVar15;
  _note *p_Var16;
  ulong uVar17;
  double (*padVar18) [58];
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  short *psVar27;
  _note **pp_Var28;
  int iVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double z [35];
  double adStack_148 [35];
  
  if ((*(byte *)((long)handle + 0x30) & 2) == 0) {
    pp_Var28 = (_note **)((long)handle + 0x348);
    do {
      p_Var11 = *pp_Var28;
      iVar19 = 0;
      iVar29 = 0;
      if (p_Var11 != (_note *)0x0) {
        iVar19 = 0;
        iVar29 = 0;
        do {
          uVar8 = p_Var11->sample_pos;
          p_Var6 = p_Var11->sample;
          iVar24 = (int)p_Var6->data[uVar8 >> 10];
          iVar20 = (uVar8 & 0x3ff) * (p_Var6->data[(ulong)(uVar8 >> 10) + 1] - iVar24);
          iVar15 = iVar20 + 0x3ff;
          if (-1 < iVar20) {
            iVar15 = iVar20;
          }
          iVar20 = (p_Var11->env_level >> 0xc) * ((iVar15 >> 10) + iVar24);
          iVar15 = iVar20 + 0x3ff;
          if (-1 < iVar20) {
            iVar15 = iVar20;
          }
          iVar24 = p_Var11->left_mix_volume * (iVar15 >> 10);
          iVar20 = iVar24 + 0x3ff;
          if (-1 < iVar24) {
            iVar20 = iVar24;
          }
          iVar24 = (iVar15 >> 10) * p_Var11->right_mix_volume;
          iVar15 = iVar24 + 0x3ff;
          if (-1 < iVar24) {
            iVar15 = iVar24;
          }
          uVar8 = uVar8 + p_Var11->sample_inc;
          p_Var11->sample_pos = uVar8;
          bVar2 = p_Var11->modes;
          if ((bVar2 & 4) == 0) {
            if (uVar8 < p_Var6->data_length) goto LAB_0033feb5;
            goto switchD_0033ff03_caseD_6;
          }
          if (p_Var6->loop_end < uVar8) {
            p_Var11->sample_pos =
                 (uVar8 - p_Var6->loop_start) % p_Var6->loop_size + p_Var6->loop_start;
          }
LAB_0033feb5:
          iVar24 = p_Var11->env_inc;
          if (iVar24 == 0) goto LAB_0033ffe4;
          iVar25 = p_Var11->env_level + iVar24;
          p_Var11->env_level = iVar25;
          if (iVar24 < 0) {
            if (iVar25 <= p_Var6->env_target[p_Var11->env]) goto LAB_0033fee8;
            goto LAB_0033ffe4;
          }
          if (iVar25 < p_Var6->env_target[p_Var11->env]) goto LAB_0033ffe4;
LAB_0033fee8:
          bVar3 = p_Var11->env;
          iVar24 = p_Var6->env_target[bVar3];
          p_Var11->env_level = iVar24;
          switch((ulong)bVar3) {
          case 0:
            if ((bVar2 & 0x40) == 0) {
LAB_0033ffc4:
              p_Var11->env_inc = 0;
              goto LAB_0033ffe4;
            }
          default:
switchD_0033ff03_caseD_1:
            p_Var11->env = bVar3 + 1;
            if (p_Var11->is_off == '\x01') {
              do_note_off_extra(p_Var11);
            }
            iVar24 = p_Var11->sample->env_rate[p_Var11->env];
            iVar25 = -iVar24;
            if (p_Var11->env_level <= p_Var11->sample->env_target[p_Var11->env]) {
              iVar25 = iVar24;
            }
            p_Var11->env_inc = iVar25;
LAB_0033ffe4:
            p_Var11 = p_Var11->next;
            break;
          case 2:
            if ((bVar2 & 0x20) != 0) goto LAB_0033ffc4;
            if (-1 < (char)bVar2) goto switchD_0033ff03_caseD_1;
            p_Var11->env = '\x05';
            iVar25 = -p_Var6->env_rate[5];
            if (iVar24 <= p_Var6->env_target[5]) {
              iVar25 = p_Var6->env_rate[5];
            }
            p_Var11->env_inc = iVar25;
            break;
          case 5:
            if (iVar24 != 0) {
              if ((bVar2 & 4) != 0) {
                p_Var11->modes = bVar2 & 0xfb;
              }
              goto LAB_0033ffc4;
            }
          case 6:
switchD_0033ff03_caseD_6:
            p_Var9 = p_Var11->replay;
            p_Var11->active = '\0';
            p_Var7 = *pp_Var28;
            if (p_Var9 == (_note *)0x0) {
              if (p_Var7 == p_Var11) {
                p_Var9 = (_note *)0x0;
              }
              else {
                do {
                  p_Var9 = p_Var7;
                  p_Var7 = p_Var9->next;
                  if (p_Var7 == p_Var11) break;
                } while (p_Var7 != (_note *)0x0);
              }
              pp_Var14 = &p_Var9->next;
              if (p_Var9 == (_note *)0x0) {
                pp_Var14 = pp_Var28;
              }
              *pp_Var14 = p_Var11->next;
              goto LAB_0033ffe4;
            }
            if (p_Var7 == p_Var11) {
              p_Var16 = (_note *)0x0;
            }
            else {
              do {
                p_Var16 = p_Var7;
                p_Var7 = p_Var16->next;
              } while (p_Var16->next != p_Var11);
            }
            pp_Var14 = &p_Var16->next;
            if (p_Var16 == (_note *)0x0) {
              pp_Var14 = pp_Var28;
            }
            *pp_Var14 = p_Var9;
            p_Var9->next = p_Var11->next;
            p_Var9->active = '\x01';
            p_Var11 = p_Var9;
          }
          iVar19 = iVar19 + (iVar20 >> 10);
          iVar29 = iVar29 + (iVar15 >> 10);
        } while (p_Var11 != (_note *)0x0);
      }
      *buffer = iVar19;
      buffer[1] = iVar29;
      buffer = buffer + 2;
      count = count - 1;
    } while (count != 0);
  }
  else {
    if (gauss_table == (double *)0x0) {
      FCriticalSection::Enter(&gauss_lock);
      pdVar10 = gauss_table;
      if (gauss_table == (double *)0x0) {
        newt_coeffs[0][0] = 1.0;
        pFVar12 = &synth_watch;
        uVar17 = 0;
        padVar18 = newt_coeffs;
        do {
          padVar1 = newt_coeffs + uVar17;
          newt_coeffs[uVar17][0] = 1.0;
          (*padVar1)[uVar17] = 1.0;
          if (1 < uVar17) {
            dVar33 = 1.0 / (double)(int)uVar17;
            dVar36 = *(double *)((long)&synth_watch + uVar17 * 0x1d0) * dVar33;
            (*padVar1)[0] = dVar36;
            (*padVar1)[uVar17] = dVar36;
            uVar23 = 1;
            do {
              (&pFVar12[9].super_FBaseCVar.m_Next)[uVar23] =
                   (FBaseCVar *)
                   (((double)(&(pFVar12->super_FBaseCVar)._vptr_FBaseCVar)[uVar23] +
                    *(double *)((long)pFVar12 + uVar23 * 8 + -8)) * dVar33);
              uVar23 = uVar23 + 1;
            } while (uVar17 != uVar23);
          }
          adStack_148[uVar17] = (double)(int)uVar17 * 0.07957747154594767;
          uVar17 = uVar17 + 1;
          pFVar12 = (FBoolCVar *)&pFVar12[9].super_FBaseCVar.m_Next;
        } while (uVar17 != 0x23);
        lVar31 = 1;
        uVar17 = 0;
        do {
          dVar33 = (double)__powidf2(0xbff0000000000000,uVar17 & 0xffffffff);
          iVar19 = (int)dVar33;
          lVar13 = 0;
          do {
            (*padVar18)[lVar13] = (double)iVar19 * (*padVar18)[lVar13];
            lVar13 = lVar13 + 1;
            iVar19 = -iVar19;
          } while (lVar31 != lVar13);
          uVar17 = uVar17 + 1;
          lVar31 = lVar31 + 1;
          padVar18 = padVar18 + 1;
        } while (uVar17 != 0x23);
        pdVar10 = (double *)malloc(0x46000);
        dVar33 = 0.0;
        lVar31 = 0;
        do {
          pdVar32 = pdVar10 + lVar31 * 0x23;
          lVar13 = 0;
          do {
            lVar30 = 0;
            dVar36 = 1.0;
            do {
              if (lVar13 != lVar30) {
                dVar35 = adStack_148[lVar30];
                dVar34 = sin((dVar33 * 0.07957747154594767 + 1.3528170162811104) - dVar35);
                dVar35 = sin(adStack_148[lVar13] - dVar35);
                dVar36 = (dVar34 * dVar36) / dVar35;
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x23);
            *pdVar32 = dVar36;
            pdVar32 = pdVar32 + 1;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x23);
          lVar31 = lVar31 + 1;
          dVar33 = dVar33 + 0.0009765625;
        } while (lVar31 != 0x400);
      }
      gauss_table = pdVar10;
      FCriticalSection::Leave(&gauss_lock);
    }
    pp_Var28 = (_note **)((long)handle + 0x348);
    do {
      p_Var11 = *pp_Var28;
      iVar29 = 0;
      iVar19 = 0;
      if (p_Var11 != (_note *)0x0) {
        iVar29 = 0;
        iVar19 = 0;
        do {
          uVar8 = p_Var11->sample_pos;
          uVar26 = uVar8 >> 10;
          p_Var6 = p_Var11->sample;
          uVar5 = p_Var6->data_length;
          iVar15 = (~uVar26 + (uVar5 >> 10)) * 2;
          if (iVar15 < 3) {
            iVar15 = 2;
          }
          uVar21 = uVar8 >> 9 | 1;
          if ((int)(iVar15 - 1U) < (int)uVar21) {
            uVar21 = iVar15 - 1U;
          }
          if ((int)uVar21 < 0x22) {
            uVar17 = (ulong)uVar21;
            uVar22 = uVar21 + 1;
            padVar18 = newt_coeffs + uVar17;
            dVar33 = 0.0;
            do {
              if (-1 < (long)uVar17) {
                uVar23 = 0;
                do {
                  dVar33 = dVar33 + (double)(int)(p_Var6->data +
                                                 (ulong)uVar26 + (long)(int)-(uVar21 >> 1))[uVar23]
                                    * (*padVar18)[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar22 != uVar23);
              }
              uVar17 = uVar17 - 1;
              dVar33 = (((double)(uVar21 >> 1) + (double)(uVar8 & 0x3ff) * 0.0009765625) -
                       (double)(int)uVar17) * dVar33;
              uVar22 = uVar22 - 1;
              padVar18 = padVar18 + -1;
            } while ((int)uVar17 != 0);
            dVar33 = dVar33 + (double)(int)p_Var6->data[(ulong)uVar26 + (long)(int)-(uVar21 >> 1)];
          }
          else {
            psVar27 = p_Var6->data + ((ulong)uVar26 - 0x11);
            dVar33 = 0.0;
            uVar17 = 0xfffffffffffffff8;
            do {
              sVar4 = *psVar27;
              psVar27 = psVar27 + 1;
              dVar33 = dVar33 + (double)(int)sVar4 *
                                *(double *)
                                 ((long)gauss_table + uVar17 + (ulong)((uVar8 & 0x3ff) * 0x118) + 8)
              ;
              uVar17 = uVar17 + 8;
            } while (uVar17 < 0x109);
          }
          iVar20 = (int)(dVar33 * 0.0009765625 * (double)(p_Var11->env_level >> 0xc));
          iVar24 = p_Var11->left_mix_volume * iVar20;
          iVar15 = iVar24 + 0x3ff;
          if (-1 < iVar24) {
            iVar15 = iVar24;
          }
          iVar20 = iVar20 * p_Var11->right_mix_volume;
          iVar24 = iVar20 + 0x3ff;
          if (-1 < iVar20) {
            iVar24 = iVar20;
          }
          uVar8 = uVar8 + p_Var11->sample_inc;
          p_Var11->sample_pos = uVar8;
          if (p_Var6->loop_end < uVar8) {
            if ((p_Var11->modes & 4) != 0) {
              p_Var11->sample_pos =
                   (uVar8 - p_Var6->loop_start) % p_Var6->loop_size + p_Var6->loop_start;
              goto LAB_0034047b;
            }
            if (uVar8 < uVar5) goto LAB_0034047b;
            goto switchD_003404d0_caseD_6;
          }
LAB_0034047b:
          iVar20 = p_Var11->env_inc;
          if (iVar20 == 0) goto LAB_003405ce;
          iVar25 = p_Var11->env_level + iVar20;
          p_Var11->env_level = iVar25;
          if (iVar20 < 0) {
            if (iVar25 <= p_Var6->env_target[p_Var11->env]) goto LAB_003404ae;
            goto LAB_003405ce;
          }
          if (iVar25 < p_Var6->env_target[p_Var11->env]) goto LAB_003405ce;
LAB_003404ae:
          bVar2 = p_Var11->env;
          iVar20 = p_Var6->env_target[bVar2];
          p_Var11->env_level = iVar20;
          switch((ulong)bVar2) {
          case 0:
            if ((p_Var11->modes & 0x40) == 0) {
LAB_00340551:
              p_Var11->env_inc = 0;
              goto LAB_003405ce;
            }
          default:
switchD_003404d0_caseD_1:
            p_Var11->env = bVar2 + 1;
            if (p_Var11->is_off == '\x01') {
              do_note_off_extra(p_Var11);
            }
            iVar20 = p_Var11->sample->env_rate[p_Var11->env];
            iVar25 = -iVar20;
            if (p_Var11->env_level <= p_Var11->sample->env_target[p_Var11->env]) {
              iVar25 = iVar20;
            }
            p_Var11->env_inc = iVar25;
LAB_003405ce:
            p_Var11 = p_Var11->next;
            break;
          case 2:
            if ((p_Var11->modes & 0x20) != 0) goto LAB_00340551;
            if (-1 < (char)p_Var11->modes) goto switchD_003404d0_caseD_1;
            p_Var11->env = '\x05';
            iVar25 = -p_Var6->env_rate[5];
            if (iVar20 <= p_Var6->env_target[5]) {
              iVar25 = p_Var6->env_rate[5];
            }
            p_Var11->env_inc = iVar25;
            break;
          case 5:
            if (iVar20 != 0) {
              if ((p_Var11->modes & 4) != 0) {
                p_Var11->modes = p_Var11->modes & 0xfb;
              }
              goto LAB_00340551;
            }
          case 6:
switchD_003404d0_caseD_6:
            p_Var9 = p_Var11->replay;
            p_Var11->active = '\0';
            p_Var7 = *pp_Var28;
            if (p_Var9 == (_note *)0x0) {
              if (p_Var7 == p_Var11) {
                p_Var9 = (_note *)0x0;
              }
              else {
                do {
                  p_Var9 = p_Var7;
                  p_Var7 = p_Var9->next;
                  if (p_Var7 == p_Var11) break;
                } while (p_Var7 != (_note *)0x0);
              }
              pp_Var14 = &p_Var9->next;
              if (p_Var9 == (_note *)0x0) {
                pp_Var14 = pp_Var28;
              }
              *pp_Var14 = p_Var11->next;
              goto LAB_003405ce;
            }
            if (p_Var7 == p_Var11) {
              p_Var16 = (_note *)0x0;
            }
            else {
              do {
                p_Var16 = p_Var7;
                p_Var7 = p_Var16->next;
              } while (p_Var16->next != p_Var11);
            }
            pp_Var14 = &p_Var16->next;
            if (p_Var16 == (_note *)0x0) {
              pp_Var14 = pp_Var28;
            }
            *pp_Var14 = p_Var9;
            p_Var9->next = p_Var11->next;
            p_Var9->active = '\x01';
            p_Var11 = p_Var9;
          }
          iVar19 = iVar19 + (iVar15 >> 10);
          iVar29 = iVar29 + (iVar24 >> 10);
        } while (p_Var11 != (_note *)0x0);
      }
      *buffer = iVar19;
      buffer[1] = iVar29;
      buffer = buffer + 2;
      count = count - 1;
    } while (count != 0);
  }
  return buffer;
}

Assistant:

int *WM_Mix(midi *handle, int *buffer, unsigned long count)
{
	if (((struct _mdi *)handle)->info.mixer_options & WM_MO_ENHANCED_RESAMPLING)
	{
		return WM_Mix_Gauss(handle, buffer, count);
	}
	else
	{
		return WM_Mix_Linear(handle, buffer, count);
	}
}